

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

uint32_t readGfxConstant(void)

{
  int iVar1;
  uint local_1c;
  uint32_t pixel;
  int c;
  uint uStack_c;
  uint8_t width;
  uint32_t bitPlaneUpper;
  uint32_t bitPlaneLower;
  
  uStack_c = 0;
  c = 0;
  pixel._3_1_ = 0;
  do {
    iVar1 = peek();
    if (iVar1 == gfxDigits[0]) {
      local_1c = 0;
LAB_001120f7:
      if (pixel._3_1_ < 8) {
        uStack_c = uStack_c << 1 | local_1c & 1;
        c = c << 1 | local_1c >> 1;
      }
      if (pixel._3_1_ < 9) {
        pixel._3_1_ = pixel._3_1_ + 1;
      }
    }
    else {
      if (iVar1 == gfxDigits[1]) {
        local_1c = 1;
        goto LAB_001120f7;
      }
      if (iVar1 == gfxDigits[2]) {
        local_1c = 2;
        goto LAB_001120f7;
      }
      if (iVar1 == gfxDigits[3]) {
        local_1c = 3;
        goto LAB_001120f7;
      }
      if ((iVar1 != 0x5f) || (pixel._3_1_ == 0)) {
        if (pixel._3_1_ == 0) {
          error("Invalid graphics constant, no digits after \'`\'\n");
        }
        else if (pixel._3_1_ == 9) {
          warning(WARNING_LARGE_CONSTANT,
                  "Graphics constant is too long, only first 8 pixels considered\n");
        }
        return c << 8 | uStack_c;
      }
    }
    shiftChar();
  } while( true );
}

Assistant:

static uint32_t readGfxConstant(void)
{
	uint32_t bitPlaneLower = 0, bitPlaneUpper = 0;
	uint8_t width = 0;

	for (;; shiftChar()) {
		int c = peek();
		uint32_t pixel;

		// Check for '_' after digits in case one of the digits is '_'
		if (c == gfxDigits[0])
			pixel = 0;
		else if (c == gfxDigits[1])
			pixel = 1;
		else if (c == gfxDigits[2])
			pixel = 2;
		else if (c == gfxDigits[3])
			pixel = 3;
		else if (c == '_' && width > 0)
			continue;
		else
			break;

		if (width < 8) {
			bitPlaneLower = bitPlaneLower << 1 | (pixel & 1);
			bitPlaneUpper = bitPlaneUpper << 1 | (pixel >> 1);
		}
		if (width < 9)
			width++;
	}

	if (width == 0)
		error("Invalid graphics constant, no digits after '`'\n");
	else if (width == 9)
		warning(WARNING_LARGE_CONSTANT,
			"Graphics constant is too long, only first 8 pixels considered\n");

	return bitPlaneUpper << 8 | bitPlaneLower;
}